

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

void helper_set_macsr_m68k(CPUM68KState_conflict *env,uint32_t val)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  char cVar5;
  ulong uVar6;
  uint64_t uVar7;
  bool bVar8;
  
  uVar1 = env->macsr;
  if (((uVar1 ^ val) & 0x60) != 0) {
    lVar4 = 0;
    do {
      uVar2 = env->macc[lVar4];
      uVar6 = uVar2 >> 0x20;
      bVar8 = (uVar1 & 0x20) != 0;
      uVar3 = uVar2;
      if (bVar8) {
        uVar6 = uVar2;
        uVar3 = uVar2 >> 8;
      }
      cVar5 = (char)(uVar2 >> 0x28);
      if (bVar8) {
        uVar7 = (long)cVar5 << 0x28 | uVar6 & 0xff | (uVar3 & 0xffffffff) << 8;
      }
      else {
        uVar6 = (uVar6 & 0xff) << 0x20;
        if ((uVar1 & 0x40) == 0) {
          uVar7 = uVar3 & 0xffffffff | uVar2 & 0xff0000000000 | uVar6;
        }
        else {
          uVar7 = (long)cVar5 << 0x28 | uVar3 & 0xffffffff | uVar6;
        }
      }
      env->macc[lVar4] = uVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
  }
  env->macsr = val;
  return;
}

Assistant:

void HELPER(set_macsr)(CPUM68KState *env, uint32_t val)
{
    uint32_t acc;
    int8_t exthigh;
    uint8_t extlow;
    uint64_t regval;
    int i;
    if ((env->macsr ^ val) & (MACSR_FI | MACSR_SU)) {
        for (i = 0; i < 4; i++) {
            regval = env->macc[i];
            exthigh = regval >> 40;
            if (env->macsr & MACSR_FI) {
                acc = regval >> 8;
                extlow = regval;
            } else {
                acc = regval;
                extlow = regval >> 32;
            }
            if (env->macsr & MACSR_FI) {
                regval = (((uint64_t)acc) << 8) | extlow;
                regval |= ((int64_t)exthigh) << 40;
            } else if (env->macsr & MACSR_SU) {
                regval = acc | (((int64_t)extlow) << 32);
                regval |= ((int64_t)exthigh) << 40;
            } else {
                regval = acc | (((uint64_t)extlow) << 32);
                regval |= ((uint64_t)(uint8_t)exthigh) << 40;
            }
            env->macc[i] = regval;
        }
    }
    env->macsr = val;
}